

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O0

double frexp(double __x,int *__exponent)

{
  bool bVar1;
  undefined4 extraout_EAX;
  undefined4 *in_RDX;
  ExactFloat *in_RSI;
  double __x_00;
  double extraout_XMM0_Qa;
  double dVar2;
  int *exp_local;
  ExactFloat *a_local;
  
  bVar1 = ExactFloat::is_normal(in_RSI);
  if (bVar1) {
    dVar2 = ExactFloat::exp(in_RSI,__x_00);
    *in_RDX = extraout_EAX;
    dVar2 = ExactFloat::exp(in_RSI,dVar2);
    dVar2 = ldexp(dVar2,(int)__exponent);
  }
  else {
    *in_RDX = 0;
    ExactFloat::ExactFloat((ExactFloat *)__exponent,in_RSI);
    dVar2 = extraout_XMM0_Qa;
  }
  return dVar2;
}

Assistant:

ExactFloat frexp(const ExactFloat& a, int* exp) {
  if (!a.is_normal()) {
    // If a == 0, exp should be zero.  If a.is_inf() or a.is_nan(), exp is not
    // defined but the glibc implementation returns zero.
    *exp = 0;
    return a;
  }
  *exp = a.exp();
  return ldexp(a, -a.exp());
}